

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QRectF * __thiscall
QWidgetEffectSourcePrivate::boundingRect
          (QRectF *__return_storage_ptr__,QWidgetEffectSourcePrivate *this,CoordinateSystem system)

{
  QRect *pQVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QRect local_40;
  undefined4 uStack_30;
  undefined4 local_2c;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (system == DeviceCoordinates) {
    if (this->context == (QWidgetPaintContext *)0x0) {
      local_40.x1.m_i = 2;
      local_2c = 0;
      local_40.y1.m_i = 0;
      local_40.x2.m_i = 0;
      local_40.y2.m_i = 0;
      uStack_30 = 0;
      local_28 = "default";
      QMessageLogger::warning
                ((char *)&local_40,
                 "QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context")
      ;
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
      goto LAB_002f9697;
    }
    pQVar1 = (QRect *)QPainter::worldTransform();
    QWidget::rect(this->m_widget);
    QVar2 = (QRect)QTransform::mapRect(pQVar1);
  }
  else {
    QVar2 = QWidget::rect(this->m_widget);
  }
  local_40.x1 = QVar2.x1.m_i;
  local_40._4_8_ = QVar2._4_8_;
  local_40.y2 = QVar2.y2.m_i;
  QRectF::QRectF(__return_storage_ptr__,&local_40);
LAB_002f9697:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetEffectSourcePrivate::boundingRect(Qt::CoordinateSystem system) const
{
    if (system != Qt::DeviceCoordinates)
        return m_widget->rect();

    if (Q_UNLIKELY(!context)) {
        // Device coordinates without context not yet supported.
        qWarning("QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
        return QRectF();
    }

    return context->painter->worldTransform().mapRect(m_widget->rect());
}